

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_decode.c
# Opt level: O2

WORD32 ihevcd_decode(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  undefined4 uVar1;
  codec_t *ps_codec;
  slice_header_t *psVar2;
  sps_t *psVar3;
  bool bVar4;
  WORD32 WVar5;
  WORD32 WVar6;
  IHEVCD_ERROR_T IVar7;
  int num_rows;
  UWORD8 *pUVar8;
  pic_buf_t *ppVar9;
  long lVar10;
  byte bVar11;
  process_ctxt_t *ppVar12;
  uint uVar13;
  IHEVCD_ERROR_T IVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ivd_video_decode_ip_t *ps_dec_ip;
  process_ctxt_t *ps_proc;
  WORD32 nal_len;
  short local_5c;
  short local_5a;
  undefined8 local_58;
  ivd_video_decode_ip_t *local_50;
  process_ctxt_t *local_48;
  WORD32 bits_len;
  process_ctxt_t *local_38;
  
  ps_codec = (codec_t *)ps_codec_obj->pv_codec_handle;
  ps_codec->i4_error_code = 0;
  uVar1 = *pv_api_op;
  memset(pv_api_op,0,0x88);
  *(undefined4 *)pv_api_op = uVar1;
  if (ps_codec->i4_init_done != 1) {
    *(undefined4 *)((long)pv_api_op + 4) = 0x40d0;
    return 1;
  }
  if (0x7ffffffe < ps_codec->u4_pic_cnt) {
    *(undefined4 *)((long)pv_api_op + 4) = 0x43de;
    return 1;
  }
  if (ps_codec->i4_reset_flag == 0) {
    if (ps_codec->i4_flush_mode == 0) {
      if (*(long *)((long)pv_api_ip + 0x10) == 0) {
        *(undefined4 *)((long)pv_api_op + 4) = 0x201e;
        return 1;
      }
      bVar4 = true;
      if (*(uint *)((long)pv_api_ip + 0xc) < 5) {
        *(uint *)((long)pv_api_op + 8) = *(uint *)((long)pv_api_ip + 0xc);
        *(undefined4 *)((long)pv_api_op + 4) = 0x2027;
        return 1;
      }
      goto LAB_0010dcfc;
    }
  }
  else {
    ps_codec->i4_flush_mode = 1;
  }
  bVar4 = false;
LAB_0010dcfc:
  if ((ps_codec->i4_share_disp_buf == 0) && (ps_codec->i4_header_mode == 0)) {
    if ((ulong)*(uint *)((long)pv_api_ip + 0x18) == 0) {
      *(undefined4 *)((long)pv_api_op + 4) = 0x201b;
    }
    else {
      uVar15 = 0;
      do {
        if (*(uint *)((long)pv_api_ip + 0x18) == uVar15) goto LAB_0010dd0f;
        if (*(long *)((long)pv_api_ip + uVar15 * 8 + 0x20) == 0) {
          *(undefined4 *)((long)pv_api_op + 4) = 0x201c;
          return 1;
        }
        lVar10 = uVar15 * 4;
        uVar15 = uVar15 + 1;
      } while (*(int *)((long)pv_api_ip + lVar10 + 0x220) != 0);
      *(undefined4 *)((long)pv_api_op + 4) = 0x201d;
    }
  }
  else {
LAB_0010dd0f:
    ps_codec->ps_out_buffer = (ivd_out_bufdesc_t *)((long)pv_api_ip + 0x18);
    ps_codec->u4_ts = *(UWORD32 *)((long)pv_api_ip + 8);
    if (!bVar4) {
      *(undefined8 *)((long)pv_api_op + 0xc) = *(undefined8 *)&ps_codec->i4_disp_wd;
      *(undefined4 *)((long)pv_api_op + 0x1c) = 0;
      ppVar9 = (pic_buf_t *)
               ihevc_disp_mgr_get((disp_mgr_t *)ps_codec->pv_disp_buf_mgr,&ps_codec->i4_disp_buf_id)
      ;
      ps_codec->ps_disp_buf = ppVar9;
      if ((ppVar9 != (pic_buf_t *)0x0) &&
         ((ps_codec->i4_share_disp_buf == 0 || (ps_codec->e_chroma_fmt == IV_YUV_420P)))) {
        if (ps_codec->as_process[0].i4_init_done == 0) {
          ihevcd_init_proc_ctxt(ps_codec->as_process,0);
        }
        ihevcd_fmt_conv(ps_codec,ps_codec->as_process,*(UWORD8 **)((long)pv_api_ip + 0x20),
                        *(UWORD8 **)((long)pv_api_ip + 0x28),*(UWORD8 **)((long)pv_api_ip + 0x30),0,
                        ps_codec->i4_disp_ht);
        ihevc_buf_mgr_release((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,ps_codec->i4_disp_buf_id,4);
      }
      ihevcd_fill_outargs(ps_codec,(ivd_video_decode_ip_t *)pv_api_ip,
                          (ivd_video_decode_op_t *)pv_api_op);
      if (ps_codec->ps_disp_buf == (pic_buf_t *)0x0) {
        if (ps_codec->i4_reset_flag != 0) {
          ihevcd_init(ps_codec);
          return 1;
        }
        return 1;
      }
      return 0;
    }
    if ((((ps_codec->i4_share_disp_buf == 1) && (ps_codec->i4_header_mode == 0)) &&
        ((buf_mgr_t *)ps_codec->pv_pic_buf_mgr != (buf_mgr_t *)0x0)) &&
       (WVar5 = ihevc_buf_mgr_check_free((buf_mgr_t *)ps_codec->pv_pic_buf_mgr), WVar5 == 0)) {
      *(undefined4 *)((long)pv_api_op + 4) = 0x2028;
    }
    else {
      ps_codec->i4_bytes_remaining = *(WORD32 *)((long)pv_api_ip + 0xc);
      ps_codec->pu1_inp_bitsbuf = *(UWORD8 **)((long)pv_api_ip + 0x10);
      (ps_codec->s_parse).i4_end_of_frame = 0;
      ps_codec->i4_pic_present = 0;
      ps_codec->i4_slice_error = 0;
      ps_codec->ps_disp_buf = (pic_buf_t *)0x0;
      local_50 = (ivd_video_decode_ip_t *)pv_api_ip;
      if (1 < ps_codec->i4_num_cores) {
        ithread_set_affinity(0);
      }
      local_48 = (process_ctxt_t *)&ps_codec->u4_bitsbuf_size_dynamic;
      local_38 = (process_ctxt_t *)&ps_codec->u4_bitsbuf_size_static;
      IVar14 = 0;
LAB_0010ddb9:
      do {
        if (ps_codec->i4_bytes_remaining < 5) {
LAB_0010e1d4:
          if (IVar14 != 0 && ps_codec->u4_pic_cnt == 0) {
            ps_codec->i4_error_code = IVar14;
            ihevcd_fill_outargs(ps_codec,local_50,(ivd_video_decode_op_t *)pv_api_op);
            return 1;
          }
          ps_dec_ip = local_50;
          if (ps_codec->i4_pic_present != 1) goto LAB_0010e45f;
          psVar3 = (ps_codec->s_parse).ps_sps;
          ps_codec->i4_first_pic_done = 1;
          if (ps_codec->i4_num_cores < 2) {
            ppVar9 = ps_codec->ps_disp_buf;
          }
          else {
            ppVar9 = ps_codec->ps_disp_buf;
            if ((ps_codec->s_parse).i4_end_of_frame != 0) {
              local_48 = ps_codec->as_process;
              if (((ppVar9 != (pic_buf_t *)0x0) &&
                  ((ps_codec->i4_share_disp_buf == 0 || (ps_codec->e_chroma_fmt == IV_YUV_420P))))
                 && ((ps_codec->u4_enable_fmt_conv_ahead == 0 ||
                     (ps_codec->i4_disp_buf_id ==
                      ps_codec->as_process[ps_codec->i4_num_cores - 1].i4_cur_pic_buf_id)))) {
                iVar16 = 0;
                while (iVar16 < psVar3->i2_pic_ht_in_ctb) {
                  nal_len = 1;
                  local_58 = 0;
                  local_5c = 0;
                  local_5a = (short)iVar16;
                  IVar14 = ihevcd_jobq_queue((jobq_t *)(ps_codec->s_parse).pv_proc_jobq,&nal_len,
                                             0x10,1);
                  iVar16 = iVar16 + 1;
                  if (IVar14 != 0) {
                    return IVar14;
                  }
                }
              }
              IVar14 = ihevcd_jobq_terminate((jobq_t *)(ps_codec->s_parse).pv_proc_jobq);
              ppVar12 = local_48;
              while( true ) {
                lVar10 = (long)ps_codec->i4_num_cores;
                IVar7 = ihevcd_jobq_dequeue((jobq_t *)ppVar12[lVar10 + -1].pv_proc_jobq,&nal_len,
                                            0x10,1);
                if (IVar7 != 0) break;
                ps_proc = ppVar12 + lVar10 + -1;
                ppVar12[lVar10 + -1].i4_ctb_cnt = (int)(short)local_58;
                ppVar12[lVar10 + -1].i4_ctb_x = (int)local_5c;
                iVar16 = (int)local_5a;
                ppVar12[lVar10 + -1].i4_ctb_y = iVar16;
                ppVar12[lVar10 + -1].i4_cur_slice_idx = (int)local_58._2_2_;
                if (nal_len == 1) {
                  psVar3 = (ps_codec->s_parse).ps_sps;
                  bVar11 = psVar3->i1_log2_ctb_size;
                  iVar17 = 1 << (bVar11 & 0x1f);
                  if (ppVar12[lVar10 + -1].i4_init_done == 0) {
                    ihevcd_init_proc_ctxt(ps_proc,0);
                    iVar16 = (int)local_5a;
                    bVar11 = psVar3->i1_log2_ctb_size;
                  }
                  iVar16 = iVar16 << (bVar11 & 0x1f);
                  num_rows = ps_codec->i4_disp_ht - iVar16;
                  if (iVar17 < num_rows) {
                    num_rows = iVar17;
                  }
                  if (num_rows < 1) {
                    num_rows = 0;
                  }
                  ihevcd_fmt_conv(ps_codec,ps_proc,(local_50->s_out_buffer).pu1_bufs[0],
                                  (local_50->s_out_buffer).pu1_bufs[1],
                                  (local_50->s_out_buffer).pu1_bufs[2],iVar16,num_rows);
                  ppVar12 = local_48;
                }
                else if (nal_len == 0) {
                  ihevcd_init_proc_ctxt(ps_proc,local_58._4_4_);
                  ihevcd_process(ps_proc);
                }
              }
LAB_0010e395:
              ihevc_buf_mgr_set_status
                        ((buf_mgr_t *)ps_codec->pv_mv_buf_mgr,
                         ps_codec->as_process[0].i4_cur_mv_bank_buf_id,2);
              ihevc_buf_mgr_set_status
                        ((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                         ps_codec->as_process[0].i4_cur_pic_buf_id,2);
              ihevc_buf_mgr_set_status
                        ((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                         ps_codec->as_process[0].i4_cur_pic_buf_id,4);
              ihevc_dpb_mgr_insert_ref
                        ((dpb_mgr_t *)ps_codec->pv_dpb_mgr,ps_codec->as_process[0].ps_cur_pic,
                         ps_codec->as_process[0].i4_cur_pic_buf_id);
              if ((ps_codec->i4_share_disp_buf == 0) && (ps_codec->ps_disp_buf != (pic_buf_t *)0x0))
              {
                ihevc_buf_mgr_release
                          ((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,ps_codec->i4_disp_buf_id,4);
              }
              ps_dec_ip = local_50;
              for (lVar10 = 0; lVar10 < (long)ps_codec->i4_num_cores + -1; lVar10 = lVar10 + 1) {
                if (ps_codec->ai4_process_thread_created[lVar10] != 0) {
                  ithread_join(ps_codec->apv_process_thread_handle[lVar10],(void **)0x0);
                  ps_codec->ai4_process_thread_created[lVar10] = 0;
                }
              }
              ps_codec->u4_pic_cnt = ps_codec->u4_pic_cnt + 1;
LAB_0010e45f:
              ihevcd_fill_outargs(ps_codec,ps_dec_ip,(ivd_video_decode_op_t *)pv_api_op);
              return IVar14;
            }
          }
          if ((ppVar9 != (pic_buf_t *)0x0) &&
             (((ps_codec->i4_share_disp_buf == 0 || (ps_codec->e_chroma_fmt == IV_YUV_420P)) &&
              ((ps_codec->s_parse).i4_end_of_frame != 0)))) {
            WVar5 = ps_codec->i4_disp_ht - (ps_codec->s_fmt_conv).i4_cur_row;
            (ps_codec->s_fmt_conv).i4_num_rows = WVar5;
            if (ps_codec->as_process[0].i4_init_done == 0) {
              ihevcd_init_proc_ctxt(ps_codec->as_process,0);
              WVar5 = (ps_codec->s_fmt_conv).i4_num_rows;
            }
            if (WVar5 < 0) {
              (ps_codec->s_fmt_conv).i4_num_rows = 0;
              WVar5 = 0;
            }
            IVar14 = ihevcd_fmt_conv(ps_codec,ps_codec->as_process,
                                     (local_50->s_out_buffer).pu1_bufs[0],
                                     (local_50->s_out_buffer).pu1_bufs[1],
                                     (local_50->s_out_buffer).pu1_bufs[2],
                                     (ps_codec->s_fmt_conv).i4_cur_row,WVar5);
            (ps_codec->s_fmt_conv).i4_cur_row =
                 (ps_codec->s_fmt_conv).i4_cur_row + (ps_codec->s_fmt_conv).i4_num_rows;
          }
          goto LAB_0010e395;
        }
        if ((ps_codec->i4_slice_error != 0) &&
           (psVar2 = (ps_codec->s_parse).ps_slice_hdr_base,
           bVar11 = (byte)(ps_codec->s_parse).i4_cur_slice_idx,
           (ps_codec->s_parse).i4_next_ctb_indx ==
           (int)((ps_codec->s_parse).ps_sps)->i2_pic_wd_in_ctb * (int)psVar2[bVar11].i2_ctb_y +
           (int)psVar2[bVar11].i2_ctb_x)) {
          ps_codec->i4_slice_error = 0;
        }
        pUVar8 = ps_codec->pu1_bitsbuf_dynamic;
        ppVar12 = local_48;
        if (pUVar8 == (UWORD8 *)0x0) {
          pUVar8 = ps_codec->pu1_bitsbuf_static;
          ppVar12 = local_38;
        }
        ps_codec->pu1_bitsbuf = pUVar8;
        ps_codec->u4_bitsbuf_size = *(UWORD32 *)&ppVar12->ps_codec;
        WVar5 = ihevcd_nal_search_start_code(ps_codec->pu1_inp_bitsbuf,ps_codec->i4_bytes_remaining)
        ;
        ps_codec->i4_nal_ofst = WVar5;
        uVar13 = ps_codec->i4_bytes_remaining - WVar5;
        if (ps_codec->u4_bitsbuf_size <= uVar13) {
          uVar13 = ps_codec->u4_bitsbuf_size;
        }
        ihevcd_nal_remv_emuln_bytes
                  (ps_codec->pu1_inp_bitsbuf + WVar5,ps_codec->pu1_bitsbuf,uVar13,&nal_len,&bits_len
                  );
        if (bits_len < (int)(ps_codec->u4_bitsbuf_size - 8)) {
          pUVar8 = ps_codec->pu1_bitsbuf + bits_len;
          pUVar8[0] = '\0';
          pUVar8[1] = '\0';
          pUVar8[2] = '\0';
          pUVar8[3] = '\0';
          pUVar8[4] = '\0';
          pUVar8[5] = '\0';
          pUVar8[6] = '\0';
          pUVar8[7] = '\0';
        }
        ps_codec->i4_num_emln_bytes = nal_len - bits_len;
        ps_codec->i4_nal_len = nal_len;
        ihevcd_bits_init(&(ps_codec->s_parse).s_bitstrm,ps_codec->pu1_bitsbuf,bits_len);
        IVar14 = ihevcd_nal_unit(ps_codec);
        if (((ps_codec->i4_pic_present != 0) &&
            (psVar3 = (ps_codec->s_parse).ps_sps,
            (ps_codec->s_parse).i4_next_ctb_indx != psVar3->i4_pic_size_in_ctb)) &&
           ((ps_codec->i4_bytes_remaining - (nal_len + WVar5) < 5 ||
            (ps_codec->i4_header_in_slice_mode != 0)))) {
          iVar17 = (ps_codec->s_parse).i4_cur_slice_idx;
          iVar16 = iVar17 + -1;
          if (iVar17 < 1) {
            iVar16 = 0;
          }
          (ps_codec->s_parse).i4_cur_slice_idx = iVar16;
          psVar2 = (ps_codec->s_parse).ps_slice_hdr_base;
          uVar13 = iVar16 + 1U & 0xff;
          psVar2[uVar13].i2_ctb_x = 0;
          psVar2[uVar13].i2_ctb_y = psVar3->i2_pic_ht_in_ctb;
          ps_codec->i4_slice_error = 1;
          goto LAB_0010ddb9;
        }
        if (IVar14 == IHEVCD_IGNORE_SLICE) {
          iVar17 = (ps_codec->s_parse).i4_cur_slice_idx;
          iVar16 = iVar17 + -1;
          if (iVar17 < 1) {
            iVar16 = 0;
          }
          (ps_codec->s_parse).i4_cur_slice_idx = iVar16;
          lVar10 = (long)nal_len + (long)WVar5;
          ps_codec->pu1_inp_bitsbuf = ps_codec->pu1_inp_bitsbuf + lVar10;
          ps_codec->i4_bytes_remaining = ps_codec->i4_bytes_remaining - (int)lVar10;
          IVar14 = IHEVCD_IGNORE_SLICE;
          goto LAB_0010ddb9;
        }
        if ((IVar14 == 0x11) || (IVar14 == 0x2a)) goto LAB_0010e1d4;
        if (IVar14 == IHEVCD_SLICE_IN_HEADER_MODE) {
          IVar14 = 0;
          goto LAB_0010e1d4;
        }
        if (ps_codec->i4_slice_error == 0) {
          WVar6 = ps_codec->i4_bytes_remaining - (WVar5 + nal_len);
LAB_0010e011:
          ps_codec->pu1_inp_bitsbuf = ps_codec->pu1_inp_bitsbuf + (WVar5 + nal_len);
          ps_codec->i4_bytes_remaining = WVar6;
        }
        else {
          WVar6 = ps_codec->i4_bytes_remaining - (WVar5 + nal_len);
          if (WVar6 < 5) goto LAB_0010e011;
        }
        if ((IVar14 != 0) || (IVar14 = 0, (ps_codec->s_parse).i4_end_of_frame != 0))
        goto LAB_0010e1d4;
        IVar14 = 0;
      } while (((ps_codec->u4_allocate_dynamic_done != 0) || (ps_codec->i4_sps_done == 0)) ||
              (WVar5 = ihevcd_allocate_dynamic_bufs(ps_codec), WVar5 == 0));
      ihevcd_free_dynamic_bufs(ps_codec);
      ps_codec->i4_error_code = 0x2b;
      *(uint *)((long)pv_api_op + 4) = *(uint *)((long)pv_api_op + 4) | 0x402b;
    }
  }
  return 1;
}

Assistant:

WORD32 ihevcd_decode(iv_obj_t *ps_codec_obj, void *pv_api_ip, void *pv_api_op)
{
    WORD32 ret = IV_SUCCESS;
    codec_t *ps_codec = (codec_t *)(ps_codec_obj->pv_codec_handle);
    ivd_video_decode_ip_t *ps_dec_ip;
    ivd_video_decode_op_t *ps_dec_op;

    WORD32 proc_idx = 0;
    WORD32 prev_proc_idx = 0;

    /* Initialize error code */
    ps_codec->i4_error_code = 0;

    ps_dec_ip = (ivd_video_decode_ip_t *)pv_api_ip;
    ps_dec_op = (ivd_video_decode_op_t *)pv_api_op;

    {
        UWORD32 u4_size = ps_dec_op->u4_size;
        memset(ps_dec_op, 0, sizeof(ivd_video_decode_op_t));
        ps_dec_op->u4_size = u4_size; //Restore size field
    }
    if(ps_codec->i4_init_done != 1)
    {
        ps_dec_op->u4_error_code |= 1 << IVD_FATALERROR;
        ps_dec_op->u4_error_code |= IHEVCD_INIT_NOT_DONE;
        return IV_FAIL;
    }

    if(ps_codec->u4_pic_cnt >= NUM_FRAMES_LIMIT)
    {
        ps_dec_op->u4_error_code |= 1 << IVD_FATALERROR;
        ps_dec_op->u4_error_code |= IHEVCD_NUM_FRAMES_LIMIT_REACHED;
        return IV_FAIL;
    }

    /* If reset flag is set, flush the existing buffers */
    if(ps_codec->i4_reset_flag)
    {
        ps_codec->i4_flush_mode = 1;
    }

    /*Data memory barries instruction,so that bitstream write by the application is complete*/
    //arm_dsb();
    /* In case the decoder is not in flush mode check for input buffer validity */
    if(0 == ps_codec->i4_flush_mode)
    {
        if(ps_dec_ip->pv_stream_buffer == NULL)
        {
            ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
            ps_dec_op->u4_error_code |= IVD_DEC_FRM_BS_BUF_NULL;
            return IV_FAIL;
        }
        if(ps_dec_ip->u4_num_Bytes <= MIN_START_CODE_LEN)
        {
            if((WORD32)ps_dec_ip->u4_num_Bytes > 0)
                ps_dec_op->u4_num_bytes_consumed = ps_dec_ip->u4_num_Bytes;
            else
                ps_dec_op->u4_num_bytes_consumed = 0;

            ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
            ps_dec_op->u4_error_code |= IVD_DEC_NUMBYTES_INV;
            return IV_FAIL;

        }
    }

#ifdef APPLY_CONCEALMENT
    {
        WORD32 num_mbs;

        num_mbs = (ps_codec->i4_wd * ps_codec->i4_ht + 255) >> 8;
        /* Reset MB Count at the beginning of every process call */
        ps_codec->mb_count = 0;
        memset(ps_codec->mb_map, 0, ((num_mbs + 7) >> 3));
    }
#endif

    if(0 == ps_codec->i4_share_disp_buf && ps_codec->i4_header_mode == 0)
    {
        UWORD32 i;
        if(ps_dec_ip->s_out_buffer.u4_num_bufs == 0)
        {
            ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
            ps_dec_op->u4_error_code |= IVD_DISP_FRM_ZERO_OP_BUFS;
            return IV_FAIL;
        }

        for(i = 0; i < ps_dec_ip->s_out_buffer.u4_num_bufs; i++)
        {
            if(ps_dec_ip->s_out_buffer.pu1_bufs[i] == NULL)
            {
                ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
                ps_dec_op->u4_error_code |= IVD_DISP_FRM_OP_BUF_NULL;
                return IV_FAIL;
            }

            if(ps_dec_ip->s_out_buffer.u4_min_out_buf_size[i] == 0)
            {
                ps_dec_op->u4_error_code |= 1 << IVD_UNSUPPORTEDPARAM;
                ps_dec_op->u4_error_code |= IVD_DISP_FRM_ZERO_OP_BUF_SIZE;
                return IV_FAIL;
            }
        }
    }

    ps_codec->ps_out_buffer = &ps_dec_ip->s_out_buffer;
    ps_codec->u4_ts = ps_dec_ip->u4_ts;
    if(ps_codec->i4_flush_mode)
    {

        ps_dec_op->u4_pic_wd = ps_codec->i4_disp_wd;
        ps_dec_op->u4_pic_ht = ps_codec->i4_disp_ht;

        ps_dec_op->u4_new_seq = 0;

        ps_codec->ps_disp_buf = (pic_buf_t *)ihevc_disp_mgr_get(
                        (disp_mgr_t *)ps_codec->pv_disp_buf_mgr, &ps_codec->i4_disp_buf_id);
        /* In case of non-shared mode, then convert/copy the frame to output buffer */
        /* Only if the codec is in non-shared mode or in shared mode but needs 420P output */
        if((ps_codec->ps_disp_buf)
                        && ((0 == ps_codec->i4_share_disp_buf)
                                        || (IV_YUV_420P
                                                        == ps_codec->e_chroma_fmt)))
        {

            process_ctxt_t *ps_proc = &ps_codec->as_process[prev_proc_idx];
            if(0 == ps_proc->i4_init_done)
            {
                ihevcd_init_proc_ctxt(ps_proc, 0);
            }

            /* Set remaining number of rows to be processed */
            ret = ihevcd_fmt_conv(ps_codec, &ps_codec->as_process[prev_proc_idx],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[0],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[1],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[2], 0,
                                  ps_codec->i4_disp_ht);

            ihevc_buf_mgr_release((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                                  ps_codec->i4_disp_buf_id, BUF_MGR_DISP);
        }

        ihevcd_fill_outargs(ps_codec, ps_dec_ip, ps_dec_op);

        if(1 == ps_dec_op->u4_output_present)
        {
            WORD32 xpos = ps_codec->i4_disp_wd - 32 - LOGO_WD;
            WORD32 ypos = ps_codec->i4_disp_ht - 32 - LOGO_HT;

            if(ypos < 0)
                ypos = 0;

            if(xpos < 0)
                xpos = 0;

            INSERT_LOGO(ps_dec_ip->s_out_buffer.pu1_bufs[0],
                        ps_dec_ip->s_out_buffer.pu1_bufs[1],
                        ps_dec_ip->s_out_buffer.pu1_bufs[2], ps_codec->i4_disp_strd,
                        xpos,
                        ypos,
                        ps_codec->e_chroma_fmt,
                        ps_codec->i4_disp_wd,
                        ps_codec->i4_disp_ht);
        }


        if(NULL == ps_codec->ps_disp_buf)
        {
            /* If in flush mode and there are no more buffers to flush,
             * check for the reset flag and reset the decoder */
            if(ps_codec->i4_reset_flag)
            {
                ihevcd_init(ps_codec);
            }
            return (IV_FAIL);
        }

        return (IV_SUCCESS);

    }
    /* In case of shared mode, check if there is a free buffer for reconstruction */
    if((0 == ps_codec->i4_header_mode) && (1 == ps_codec->i4_share_disp_buf))
    {
        WORD32 buf_status;
        buf_status = 1;
        if(ps_codec->pv_pic_buf_mgr)
            buf_status = ihevc_buf_mgr_check_free((buf_mgr_t *)ps_codec->pv_pic_buf_mgr);

        /* If there is no free buffer, then return with an error code */
        if(0 == buf_status)
        {
            ps_dec_op->u4_error_code = IVD_DEC_REF_BUF_NULL;
            ps_dec_op->u4_error_code |= (1 << IVD_UNSUPPORTEDPARAM);
            return IV_FAIL;
        }
    }
    ps_codec->i4_bytes_remaining = ps_dec_ip->u4_num_Bytes;
    ps_codec->pu1_inp_bitsbuf = (UWORD8 *)ps_dec_ip->pv_stream_buffer;
    ps_codec->s_parse.i4_end_of_frame = 0;

    ps_codec->i4_pic_present = 0;
    ps_codec->i4_slice_error = 0;
    ps_codec->ps_disp_buf = NULL;

    if(ps_codec->i4_num_cores > 1)
    {
        ithread_set_affinity(0);
    }
    while(MIN_START_CODE_LEN < ps_codec->i4_bytes_remaining)
    {
        WORD32 nal_len;
        WORD32 nal_ofst;
        WORD32 bits_len;

        if(ps_codec->i4_slice_error)
        {
            slice_header_t *ps_slice_hdr_next = ps_codec->s_parse.ps_slice_hdr_base + (ps_codec->s_parse.i4_cur_slice_idx & (MAX_SLICE_HDR_CNT - 1));
            WORD32 next_slice_addr = ps_slice_hdr_next->i2_ctb_x +
                            ps_slice_hdr_next->i2_ctb_y * ps_codec->s_parse.ps_sps->i2_pic_wd_in_ctb;
            if(ps_codec->s_parse.i4_next_ctb_indx == next_slice_addr)
                ps_codec->i4_slice_error = 0;
        }

        if(ps_codec->pu1_bitsbuf_dynamic)
        {
            ps_codec->pu1_bitsbuf = ps_codec->pu1_bitsbuf_dynamic;
            ps_codec->u4_bitsbuf_size = ps_codec->u4_bitsbuf_size_dynamic;
        }
        else
        {
            ps_codec->pu1_bitsbuf = ps_codec->pu1_bitsbuf_static;
            ps_codec->u4_bitsbuf_size = ps_codec->u4_bitsbuf_size_static;
        }

        nal_ofst = ihevcd_nal_search_start_code(ps_codec->pu1_inp_bitsbuf,
                                                ps_codec->i4_bytes_remaining);

        ps_codec->i4_nal_ofst = nal_ofst;
        {
            WORD32 bytes_remaining = ps_codec->i4_bytes_remaining - nal_ofst;

            bytes_remaining = MIN((UWORD32)bytes_remaining, ps_codec->u4_bitsbuf_size);
            ihevcd_nal_remv_emuln_bytes(ps_codec->pu1_inp_bitsbuf + nal_ofst,
                                        ps_codec->pu1_bitsbuf,
                                        bytes_remaining,
                                        &nal_len, &bits_len);

            /* Decoder may read upto 8 extra bytes at the end of frame */
            /* These are not used, but still set them to zero to avoid uninitialized reads */
            if(bits_len < (WORD32)(ps_codec->u4_bitsbuf_size - 8))
            {
                memset(ps_codec->pu1_bitsbuf + bits_len, 0, 2 * sizeof(UWORD32));
            }
        }
        /* This may be used to update the offsets for tiles and entropy sync row offsets */
        ps_codec->i4_num_emln_bytes = nal_len - bits_len;
        ps_codec->i4_nal_len = nal_len;

        ihevcd_bits_init(&ps_codec->s_parse.s_bitstrm, ps_codec->pu1_bitsbuf,
                         bits_len);

        ret = ihevcd_nal_unit(ps_codec);

        /* If the frame is incomplete and
         * the bytes remaining is zero or a header is received,
         * complete the frame treating it to be in error */
        if(ps_codec->i4_pic_present &&
                        (ps_codec->s_parse.i4_next_ctb_indx != ps_codec->s_parse.ps_sps->i4_pic_size_in_ctb))
        {
            if((ps_codec->i4_bytes_remaining - (nal_len + nal_ofst) <= MIN_START_CODE_LEN) ||
                            (ps_codec->i4_header_in_slice_mode))
            {
                slice_header_t *ps_slice_hdr_next;

                ps_codec->s_parse.i4_cur_slice_idx--;
                if(ps_codec->s_parse.i4_cur_slice_idx < 0)
                    ps_codec->s_parse.i4_cur_slice_idx = 0;

                ps_slice_hdr_next = ps_codec->s_parse.ps_slice_hdr_base + ((ps_codec->s_parse.i4_cur_slice_idx + 1) & (MAX_SLICE_HDR_CNT - 1));
                ps_slice_hdr_next->i2_ctb_x = 0;
                ps_slice_hdr_next->i2_ctb_y = ps_codec->s_parse.ps_sps->i2_pic_ht_in_ctb;
                ps_codec->i4_slice_error = 1;
                continue;
            }
        }

        if(IHEVCD_IGNORE_SLICE == ret)
        {
            ps_codec->s_parse.i4_cur_slice_idx = MAX(0, (ps_codec->s_parse.i4_cur_slice_idx - 1));
            ps_codec->pu1_inp_bitsbuf += (nal_ofst + nal_len);
            ps_codec->i4_bytes_remaining -= (nal_ofst + nal_len);

            continue;
        }

        if((IVD_RES_CHANGED == ret) ||
           (IVD_STREAM_WIDTH_HEIGHT_NOT_SUPPORTED == ret))
        {
            break;
        }

        /* Update bytes remaining and bytes consumed and input bitstream pointer */
        /* Do not consume the NAL in the following cases */
        /* Slice header reached during header decode mode */
        /* TODO: Next picture's slice reached */
        if(ret != IHEVCD_SLICE_IN_HEADER_MODE)
        {
            if((0 == ps_codec->i4_slice_error) ||
                            (ps_codec->i4_bytes_remaining - (nal_len + nal_ofst) <= MIN_START_CODE_LEN))
            {
                ps_codec->pu1_inp_bitsbuf += (nal_ofst + nal_len);
                ps_codec->i4_bytes_remaining -= (nal_ofst + nal_len);
            }
            if(ret != IHEVCD_SUCCESS)
                break;

            if(ps_codec->s_parse.i4_end_of_frame)
                break;
        }
        else
        {
            ret = IHEVCD_SUCCESS;
            break;
        }

        /* Allocate dynamic bitstream buffer once SPS is decoded */
        if((ps_codec->u4_allocate_dynamic_done == 0) && ps_codec->i4_sps_done)
        {
            WORD32 ret;
            ret = ihevcd_allocate_dynamic_bufs(ps_codec);
            if(ret != IV_SUCCESS)
            {
                /* Free any dynamic buffers that are allocated */
                ihevcd_free_dynamic_bufs(ps_codec);
                ps_codec->i4_error_code = IVD_MEM_ALLOC_FAILED;
                ps_dec_op->u4_error_code |= 1 << IVD_FATALERROR;
                ps_dec_op->u4_error_code |= IVD_MEM_ALLOC_FAILED;

                return IV_FAIL;
            }
        }

        BREAK_AFTER_SLICE_NAL();
    }

    if((ps_codec->u4_pic_cnt == 0) && (ret != IHEVCD_SUCCESS))
    {
        ps_codec->i4_error_code = ret;

        ihevcd_fill_outargs(ps_codec, ps_dec_ip, ps_dec_op);
        return IV_FAIL;
    }

    if(1 == ps_codec->i4_pic_present)
    {
        WORD32 i;
        sps_t *ps_sps = ps_codec->s_parse.ps_sps;
        ps_codec->i4_first_pic_done = 1;

        /*TODO temporary fix: end_of_frame is checked before adding format conversion to job queue         */
        if(ps_codec->i4_num_cores > 1 && ps_codec->s_parse.i4_end_of_frame)
        {

            /* Add job queue for format conversion / frame copy for each ctb row */
            /* Only if the codec is in non-shared mode or in shared mode but needs 420P output */
            process_ctxt_t *ps_proc;

            /* i4_num_cores - 1 contexts are currently being used by other threads */
            ps_proc = &ps_codec->as_process[ps_codec->i4_num_cores - 1];

            if((ps_codec->ps_disp_buf) &&
               ((0 == ps_codec->i4_share_disp_buf) || (IV_YUV_420P == ps_codec->e_chroma_fmt)))
            {
                /* If format conversion jobs were not issued in pic_init() add them here */
                if((0 == ps_codec->u4_enable_fmt_conv_ahead) ||
                                (ps_codec->i4_disp_buf_id == ps_proc->i4_cur_pic_buf_id))
                    for(i = 0; i < ps_sps->i2_pic_ht_in_ctb; i++)
                    {
                        proc_job_t s_job;
                        IHEVCD_ERROR_T ret;
                        s_job.i4_cmd = CMD_FMTCONV;
                        s_job.i2_ctb_cnt = 0;
                        s_job.i2_ctb_x = 0;
                        s_job.i2_ctb_y = i;
                        s_job.i2_slice_idx = 0;
                        s_job.i4_tu_coeff_data_ofst = 0;
                        ret = ihevcd_jobq_queue((jobq_t *)ps_codec->s_parse.pv_proc_jobq,
                                                &s_job, sizeof(proc_job_t), 1);
                        if(ret != (IHEVCD_ERROR_T)IHEVCD_SUCCESS)
                            return (WORD32)ret;
                    }
            }
            /* Reached end of frame : Signal terminate */
            /* The terminate flag is checked only after all the jobs are dequeued */
            ret = ihevcd_jobq_terminate((jobq_t *)ps_codec->s_parse.pv_proc_jobq);

            while(1)
            {
                IHEVCD_ERROR_T ret;
                proc_job_t s_job;
                process_ctxt_t *ps_proc;

                /* i4_num_cores - 1 contexts are currently being used by other threads */
                ps_proc = &ps_codec->as_process[ps_codec->i4_num_cores - 1];

                ret = ihevcd_jobq_dequeue((jobq_t *)ps_proc->pv_proc_jobq, &s_job,
                                          sizeof(proc_job_t), 1);
                if((IHEVCD_ERROR_T)IHEVCD_SUCCESS != ret)
                    break;

                ps_proc->i4_ctb_cnt = s_job.i2_ctb_cnt;
                ps_proc->i4_ctb_x = s_job.i2_ctb_x;
                ps_proc->i4_ctb_y = s_job.i2_ctb_y;
                ps_proc->i4_cur_slice_idx = s_job.i2_slice_idx;

                if(CMD_PROCESS == s_job.i4_cmd)
                {
                    ihevcd_init_proc_ctxt(ps_proc, s_job.i4_tu_coeff_data_ofst);

                    ihevcd_process(ps_proc);
                }
                else if(CMD_FMTCONV == s_job.i4_cmd)
                {
                    sps_t *ps_sps = ps_codec->s_parse.ps_sps;
                    WORD32 num_rows = 1 << ps_sps->i1_log2_ctb_size;
                    if(0 == ps_proc->i4_init_done)
                    {
                        ihevcd_init_proc_ctxt(ps_proc, 0);
                    }

                    num_rows = MIN(num_rows, (ps_codec->i4_disp_ht - (s_job.i2_ctb_y << ps_sps->i1_log2_ctb_size)));
                    if(num_rows < 0)
                        num_rows = 0;

                    ihevcd_fmt_conv(ps_codec, ps_proc,
                                    ps_dec_ip->s_out_buffer.pu1_bufs[0],
                                    ps_dec_ip->s_out_buffer.pu1_bufs[1],
                                    ps_dec_ip->s_out_buffer.pu1_bufs[2],
                                    s_job.i2_ctb_y << ps_sps->i1_log2_ctb_size,
                                    num_rows);
                }
            }
        }
        /* In case of non-shared mode and while running in single core mode, then convert/copy the frame to output buffer */
        /* Only if the codec is in non-shared mode or in shared mode but needs 420P output */
        else if((ps_codec->ps_disp_buf) && ((0 == ps_codec->i4_share_disp_buf) ||
                                            (IV_YUV_420P == ps_codec->e_chroma_fmt)) &&
                        (ps_codec->s_parse.i4_end_of_frame))
        {
            process_ctxt_t *ps_proc = &ps_codec->as_process[proc_idx];
            /* Set remaining number of rows to be processed */
            ps_codec->s_fmt_conv.i4_num_rows = ps_codec->i4_disp_ht
                            - ps_codec->s_fmt_conv.i4_cur_row;
            if(0 == ps_proc->i4_init_done)
            {
                ihevcd_init_proc_ctxt(ps_proc, 0);
            }

            if(ps_codec->s_fmt_conv.i4_num_rows < 0)
                ps_codec->s_fmt_conv.i4_num_rows = 0;

            ret = ihevcd_fmt_conv(ps_codec, ps_proc,
                                  ps_dec_ip->s_out_buffer.pu1_bufs[0],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[1],
                                  ps_dec_ip->s_out_buffer.pu1_bufs[2],
                                  ps_codec->s_fmt_conv.i4_cur_row,
                                  ps_codec->s_fmt_conv.i4_num_rows);
            ps_codec->s_fmt_conv.i4_cur_row += ps_codec->s_fmt_conv.i4_num_rows;

        }


        DEBUG_DUMP_MV_MAP(ps_codec);

        /* Mark MV Buf as needed for reference */
        ihevc_buf_mgr_set_status((buf_mgr_t *)ps_codec->pv_mv_buf_mgr,
                                 ps_codec->as_process[proc_idx].i4_cur_mv_bank_buf_id,
                                 BUF_MGR_REF);

        /* Mark pic buf as needed for reference */
        ihevc_buf_mgr_set_status((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                                 ps_codec->as_process[proc_idx].i4_cur_pic_buf_id,
                                 BUF_MGR_REF);

        /* Mark pic buf as needed for display */
        ihevc_buf_mgr_set_status((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                                 ps_codec->as_process[proc_idx].i4_cur_pic_buf_id,
                                 BUF_MGR_DISP);

        /* Insert the current picture as short term reference */
        ihevc_dpb_mgr_insert_ref((dpb_mgr_t *)ps_codec->pv_dpb_mgr,
                                 ps_codec->as_process[proc_idx].ps_cur_pic,
                                 ps_codec->as_process[proc_idx].i4_cur_pic_buf_id);

        /* If a frame was displayed (in non-shared mode), then release it from display manager */
        if((0 == ps_codec->i4_share_disp_buf) && (ps_codec->ps_disp_buf))
            ihevc_buf_mgr_release((buf_mgr_t *)ps_codec->pv_pic_buf_mgr,
                                  ps_codec->i4_disp_buf_id, BUF_MGR_DISP);

        /* Wait for threads */
        for(i = 0; i < (ps_codec->i4_num_cores - 1); i++)
        {
            if(ps_codec->ai4_process_thread_created[i])
            {
                ithread_join(ps_codec->apv_process_thread_handle[i], NULL);
                ps_codec->ai4_process_thread_created[i] = 0;
            }
        }

        DEBUG_VALIDATE_PADDED_REGION(&ps_codec->as_process[proc_idx]);
        if(ps_codec->u4_pic_cnt > 0)
        {
            DEBUG_DUMP_PIC_PU(ps_codec);
        }
        DEBUG_DUMP_PIC_BUFFERS(ps_codec);

        /* Increment the number of pictures decoded */
        ps_codec->u4_pic_cnt++;
    }
    ihevcd_fill_outargs(ps_codec, ps_dec_ip, ps_dec_op);

    if(1 == ps_dec_op->u4_output_present)
    {
        WORD32 xpos = ps_codec->i4_disp_wd - 32 - LOGO_WD;
        WORD32 ypos = ps_codec->i4_disp_ht - 32 - LOGO_HT;

        if(ypos < 0)
            ypos = 0;

        if(xpos < 0)
            xpos = 0;

        INSERT_LOGO(ps_dec_ip->s_out_buffer.pu1_bufs[0],
                    ps_dec_ip->s_out_buffer.pu1_bufs[1],
                    ps_dec_ip->s_out_buffer.pu1_bufs[2], ps_codec->i4_disp_strd,
                    xpos,
                    ypos,
                    ps_codec->e_chroma_fmt,
                    ps_codec->i4_disp_wd,
                    ps_codec->i4_disp_ht);
    }


    return ret;
}